

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall RecordSet::Addp(RecordSet *this,Addr *p)

{
  bool bVar1;
  Addr *p_local;
  RecordSet *this_local;
  
  bVar1 = Equalp(this,*p,-1,-1);
  if (bVar1) {
    p->BlockNum = 1;
    p->FileOff = 0;
  }
  else if (p->FileOff == (int)(0x2000 / (long)this->RECORD_SIZE) + -1) {
    p->FileOff = 0;
    p->BlockNum = p->BlockNum + 1;
  }
  else {
    p->FileOff = p->FileOff + 1;
  }
  return;
}

Assistant:

void RecordSet::Addp(Addr& p) {
	if (Equalp(p, -1, -1)) {
		p.BlockNum = 1;
		p.FileOff = 0;
	}
	else if(p.FileOff == MAX_RECORD-1){
		p.FileOff = 0;
		p.BlockNum++;
	}
	else {
		p.FileOff++;
	}
}